

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UBool repTextAccess(UText *ut,int64_t index,UBool forward)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int64_t iVar14;
  UChar *buff;
  UnicodeString buffer;
  
  plVar2 = (long *)ut->context;
  iVar4 = (**(code **)(*plVar2 + 0x40))(plVar2);
  lVar11 = (long)iVar4;
  iVar14 = index;
  if (lVar11 < index) {
    iVar14 = lVar11;
  }
  lVar6 = 0;
  if (-1 < index) {
    lVar6 = iVar14;
  }
  iVar12 = (int)iVar14;
  if (-1 >= index) {
    iVar12 = 0;
  }
  lVar9 = (long)iVar12;
  lVar8 = ut->chunkNativeStart;
  iVar5 = (int)lVar8;
  if (forward == '\0') {
    if ((lVar8 < lVar9) && (lVar9 <= ut->chunkNativeLimit)) {
      ut->chunkOffset = iVar12 - iVar5;
      return '\x01';
    }
    if (lVar8 == 0 && iVar12 == 0) {
      ut->chunkOffset = 0;
      return '\0';
    }
    uVar10 = 0;
    if (8 < iVar12) {
      uVar10 = (ulong)(iVar12 - 9);
    }
    ut->chunkNativeStart = uVar10;
    lVar6 = (long)(iVar12 + 1);
    if (iVar4 <= iVar12) {
      lVar6 = lVar11;
    }
    ut->chunkNativeLimit = lVar6;
  }
  else {
    if ((lVar8 <= lVar9) && (lVar9 < ut->chunkNativeLimit)) {
      ut->chunkOffset = (int)lVar6 - iVar5;
      return '\x01';
    }
    if ((iVar4 <= iVar12) && (ut->chunkNativeLimit == lVar11)) {
      ut->chunkOffset = iVar4 - iVar5;
      return '\0';
    }
    lVar8 = lVar6 + 9;
    if (lVar11 <= lVar6 + 9) {
      lVar8 = lVar11;
    }
    ut->chunkNativeLimit = lVar8;
    lVar6 = 0;
    if (9 < lVar8) {
      lVar6 = lVar8 + -10;
    }
    ut->chunkNativeStart = lVar6;
  }
  buff = (UChar *)ut->pExtra;
  icu_63::UnicodeString::UnicodeString(&buffer,buff,0,10);
  (**(code **)(*plVar2 + 0x18))(plVar2,(int)ut->chunkNativeStart,(int)ut->chunkNativeLimit,&buffer);
  ut->chunkContents = buff;
  lVar6 = ut->chunkNativeLimit;
  lVar8 = ut->chunkNativeStart;
  uVar7 = (int)lVar6 - (int)lVar8;
  ut->chunkLength = uVar7;
  uVar13 = iVar12 - (int)lVar8;
  ut->chunkOffset = uVar13;
  if ((lVar6 < lVar11) && ((buff[(long)(int)uVar7 + -1] & 0xfc00U) == 0xd800)) {
    uVar1 = uVar7 - 1;
    ut->chunkLength = uVar1;
    ut->chunkNativeLimit = lVar6 + -1;
    bVar3 = (int)uVar7 <= (int)uVar13;
    uVar7 = uVar1;
    if (bVar3) {
      ut->chunkOffset = uVar1;
      uVar13 = uVar1;
    }
  }
  if ((0 < lVar8) && ((*buff & 0xfc00U) == 0xdc00)) {
    buff = buff + 1;
    ut->chunkContents = buff;
    ut->chunkNativeStart = lVar8 + 1;
    uVar7 = uVar7 - 1;
    ut->chunkLength = uVar7;
    uVar13 = uVar13 - 1;
    ut->chunkOffset = uVar13;
  }
  if (((0 < (int)uVar13) && ((buff[(int)uVar13] & 0xfc00U) == 0xdc00)) &&
     ((buff[(ulong)uVar13 - 1] & 0xfc00U) == 0xd800)) {
    ut->chunkOffset = uVar13 - 1;
  }
  ut->nativeIndexingLimit = uVar7;
  icu_63::UnicodeString::~UnicodeString(&buffer);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV
repTextAccess(UText *ut, int64_t index, UBool forward) {
    const Replaceable *rep=(const Replaceable *)ut->context;
    int32_t length=rep->length();   // Full length of the input text (bigger than a chunk)

    // clip the requested index to the limits of the text.
    int32_t index32 = pinIndex(index, length);
    U_ASSERT(index<=INT32_MAX);


    /*
     * Compute start/limit boundaries around index, for a segment of text
     * to be extracted.
     * To allow for the possibility that our user gave an index to the trailing
     * half of a surrogate pair, we must request one extra preceding UChar when
     * going in the forward direction.  This will ensure that the buffer has the
     * entire code point at the specified index.
     */
    if(forward) {

        if (index32>=ut->chunkNativeStart && index32<ut->chunkNativeLimit) {
            // Buffer already contains the requested position.
            ut->chunkOffset = (int32_t)(index - ut->chunkNativeStart);
            return TRUE;
        }
        if (index32>=length && ut->chunkNativeLimit==length) {
            // Request for end of string, and buffer already extends up to it.
            // Can't get the data, but don't change the buffer.
            ut->chunkOffset = length - (int32_t)ut->chunkNativeStart;
            return FALSE;
        }

        ut->chunkNativeLimit = index + REP_TEXT_CHUNK_SIZE - 1;
        // Going forward, so we want to have the buffer with stuff at and beyond
        //   the requested index.  The -1 gets us one code point before the
        //   requested index also, to handle the case of the index being on
        //   a trail surrogate of a surrogate pair.
        if(ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
        // unless buffer ran off end, start is index-1.
        ut->chunkNativeStart = ut->chunkNativeLimit - REP_TEXT_CHUNK_SIZE;
        if(ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }
    } else {
        // Reverse iteration.  Fill buffer with data preceding the requested index.
        if (index32>ut->chunkNativeStart && index32<=ut->chunkNativeLimit) {
            // Requested position already in buffer.
            ut->chunkOffset = index32 - (int32_t)ut->chunkNativeStart;
            return TRUE;
        }
        if (index32==0 && ut->chunkNativeStart==0) {
            // Request for start, buffer already begins at start.
            //  No data, but keep the buffer as is.
            ut->chunkOffset = 0;
            return FALSE;
        }

        // Figure out the bounds of the chunk to extract for reverse iteration.
        // Need to worry about chunk not splitting surrogate pairs, and while still
        // containing the data we need.
        // Fix by requesting a chunk that includes an extra UChar at the end.
        // If this turns out to be a lead surrogate, we can lop it off and still have
        //   the data we wanted.
        ut->chunkNativeStart = index32 + 1 - REP_TEXT_CHUNK_SIZE;
        if (ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }

        ut->chunkNativeLimit = index32 + 1;
        if (ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
    }

    // Extract the new chunk of text from the Replaceable source.
    ReplExtra *ex = (ReplExtra *)ut->pExtra;
    // UnicodeString with its buffer a writable alias to the chunk buffer
    UnicodeString buffer(ex->s, 0 /*buffer length*/, REP_TEXT_CHUNK_SIZE /*buffer capacity*/);
    rep->extractBetween((int32_t)ut->chunkNativeStart, (int32_t)ut->chunkNativeLimit, buffer);

    ut->chunkContents  = ex->s;
    ut->chunkLength    = (int32_t)(ut->chunkNativeLimit - ut->chunkNativeStart);
    ut->chunkOffset    = (int32_t)(index32 - ut->chunkNativeStart);

    // Surrogate pairs from the input text must not span chunk boundaries.
    // If end of chunk could be the start of a surrogate, trim it off.
    if (ut->chunkNativeLimit < length &&
        U16_IS_LEAD(ex->s[ut->chunkLength-1])) {
            ut->chunkLength--;
            ut->chunkNativeLimit--;
            if (ut->chunkOffset > ut->chunkLength) {
                ut->chunkOffset = ut->chunkLength;
            }
        }

    // if the first UChar in the chunk could be the trailing half of a surrogate pair,
    // trim it off.
    if(ut->chunkNativeStart>0 && U16_IS_TRAIL(ex->s[0])) {
        ++(ut->chunkContents);
        ++(ut->chunkNativeStart);
        --(ut->chunkLength);
        --(ut->chunkOffset);
    }

    // adjust the index/chunkOffset to a code point boundary
    U16_SET_CP_START(ut->chunkContents, 0, ut->chunkOffset);

    // Use fast indexing for get/setNativeIndex()
    ut->nativeIndexingLimit = ut->chunkLength;

    return TRUE;
}